

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estring.cpp
# Opt level: O2

Vec4f __thiscall embree::string_to_Vec4f(embree *this,string *str)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  Vec4f VVar4;
  size_t next;
  string local_48 [32];
  
  next = 0;
  fVar1 = std::__cxx11::stof(str,&next);
  std::__cxx11::string::substr((ulong)local_48,(ulong)str);
  std::__cxx11::string::operator=((string *)str,local_48);
  std::__cxx11::string::~string(local_48);
  fVar2 = std::__cxx11::stof(str,&next);
  std::__cxx11::string::substr((ulong)local_48,(ulong)str);
  std::__cxx11::string::operator=((string *)str,local_48);
  std::__cxx11::string::~string(local_48);
  fVar3 = std::__cxx11::stof(str,&next);
  std::__cxx11::string::substr((ulong)local_48,(ulong)str);
  std::__cxx11::string::operator=((string *)str,local_48);
  std::__cxx11::string::~string(local_48);
  VVar4.field_0._0_4_ = std::__cxx11::stof(str,&next);
  VVar4.field_0.field_0.y = (float)extraout_XMM0_Db;
  *(float *)this = fVar1;
  *(float *)(this + 4) = fVar2;
  *(float *)(this + 8) = fVar3;
  *(float *)(this + 0xc) = VVar4.field_0._0_4_;
  VVar4.field_0.field_0.z = fVar3;
  VVar4.field_0.field_0.w = 0.0;
  return (Vec4f)VVar4.field_0;
}

Assistant:

Vec4f string_to_Vec4f ( std::string str )
  {
    size_t next = 0;
    const float x = std::stof(str,&next); str = str.substr(next+1);
    const float y = std::stof(str,&next); str = str.substr(next+1);
    const float z = std::stof(str,&next); str = str.substr(next+1);
    const float w = std::stof(str,&next);
    return Vec4f(x,y,z,w);
  }